

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.h
# Opt level: O0

VertexOutEdgeIds __thiscall
S2Builder::Graph::VertexOutMap::edge_ids(VertexOutMap *this,VertexId v0,VertexId v1)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [8];
  pair<int,_int> *ppVar4;
  const_reference pvVar5;
  pair<int,_int> *ppVar6;
  pair<int,_int> *ppVar7;
  pair<int,_int> local_38;
  undefined1 local_30 [8];
  pair<const_std::pair<int,_int>_*,_const_std::pair<int,_int>_*> range;
  VertexId v1_local;
  VertexId v0_local;
  VertexOutMap *this_local;
  
  range.second._0_4_ = v1;
  range.second._4_4_ = v0;
  ppVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::data
                     (this->edges_);
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&this->edge_begins_,(long)range.second._4_4_);
  iVar1 = *pvVar5;
  ppVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::data
                     (this->edges_);
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&this->edge_begins_,(long)(range.second._4_4_ + 1));
  iVar2 = *pvVar5;
  std::pair<int,_int>::pair<int_&,_int_&,_true>
            (&local_38,(int *)((long)&range.second + 4),(int *)&range.second);
  _local_30 = std::equal_range<std::pair<int,int>const*,std::pair<int,int>>
                        (ppVar4 + iVar1,ppVar6 + iVar2,&local_38);
  auVar3 = local_30;
  ppVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::data
                     (this->edges_);
  ppVar4 = range.first;
  ppVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::data
                     (this->edges_);
  VertexOutEdgeIds::VertexOutEdgeIds
            ((VertexOutEdgeIds *)&this_local,(EdgeId)((long)auVar3 - (long)ppVar6 >> 3),
             (EdgeId)((long)ppVar4 - (long)ppVar7 >> 3));
  return (VertexOutEdgeIds)this_local;
}

Assistant:

inline S2Builder::Graph::VertexOutEdgeIds
S2Builder::Graph::VertexOutMap::edge_ids(VertexId v0, VertexId v1) const {
  auto range = std::equal_range(edges_->data() + edge_begins_[v0],
                                edges_->data() + edge_begins_[v0 + 1],
                                Edge(v0, v1));
  return VertexOutEdgeIds(
      static_cast<S2Builder::Graph::EdgeId>(range.first - edges_->data()),
      static_cast<S2Builder::Graph::EdgeId>(range.second - edges_->data()));
}